

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_stats(void **param_1)

{
  roaring64_bitmap_t *r;
  uint32_t i;
  uint64_t uVar1;
  ulong val;
  roaring64_statistics_t stats;
  roaring64_statistics_t rStack_88;
  
  r = roaring64_bitmap_create();
  _assert_true((unsigned_long)r,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x7a7);
  uVar1 = 100;
  do {
    roaring64_bitmap_add(r,uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 1000);
  val = 0x3de;
  do {
    val = val + 10;
    roaring64_bitmap_add(r,val);
  } while (val < 0x18696);
  roaring64_bitmap_add(r,100000);
  roaring64_bitmap_statistics(r,&rStack_88);
  uVar1 = roaring64_bitmap_get_cardinality(r);
  _assert_int_equal(rStack_88.cardinality,uVar1,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x7b3);
  _assert_int_equal(rStack_88.min_value,100,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x7b4);
  _assert_int_equal(rStack_88.max_value,100000,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x7b5);
  roaring64_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_stats) {
    // create a new empty bitmap
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    assert_non_null(r1);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        roaring64_bitmap_add(r1, i);
    }
    for (uint32_t i = 1000; i < 100000; i += 10) {
        roaring64_bitmap_add(r1, i);
    }
    roaring64_bitmap_add(r1, 100000);

    roaring64_statistics_t stats;
    roaring64_bitmap_statistics(r1, &stats);
    assert_int_equal(stats.cardinality, roaring64_bitmap_get_cardinality(r1));
    assert_int_equal(stats.min_value, 100);
    assert_int_equal(stats.max_value, 100000);
    roaring64_bitmap_free(r1);
}